

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::prepare_access_chain_for_scalar_access
          (CompilerMSL *this,string *expr,SPIRType *type,StorageClass storage,bool *is_packed)

{
  string local_a0;
  string local_80 [32];
  string local_60;
  char *local_40;
  char *addr_space;
  bool *is_packed_local;
  SPIRType *pSStack_28;
  StorageClass storage_local;
  SPIRType *type_local;
  string *expr_local;
  CompilerMSL *this_local;
  
  if (((*is_packed & 1U) == 0) && ((storage == StorageBuffer || (storage == StorageClassWorkgroup)))
     ) {
    local_40 = "device";
    if (storage == StorageClassWorkgroup) {
      local_40 = "threadgroup";
    }
    addr_space = is_packed;
    is_packed_local._4_4_ = storage;
    pSStack_28 = type;
    type_local = (SPIRType *)expr;
    expr_local = (string *)this;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_80,this,type,0);
    CompilerGLSL::enclose_expression(&local_a0,&this->super_CompilerGLSL,(string *)type_local);
    join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&local_60,(spirv_cross *)0x59db21,(char (*) [3])&local_40,(char **)0x57fa85,
               (char (*) [2])local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5abb58,
               (char (*) [4])&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
               (char (*) [2])this);
    ::std::__cxx11::string::operator=((string *)type_local,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string(local_80);
    *addr_space = '\x01';
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::prepare_access_chain_for_scalar_access(std::string &expr, const SPIRType &type,
                                                         spv::StorageClass storage, bool &is_packed)
{
	// If there is any risk of writes happening with the access chain in question,
	// and there is a risk of concurrent write access to other components,
	// we must cast the access chain to a plain pointer to ensure we only access the exact scalars we expect.
	// The MSL compiler refuses to allow component-level access for any non-packed vector types.
	if (!is_packed && (storage == StorageClassStorageBuffer || storage == StorageClassWorkgroup))
	{
		const char *addr_space = storage == StorageClassWorkgroup ? "threadgroup" : "device";
		expr = join("((", addr_space, " ", type_to_glsl(type), "*)&", enclose_expression(expr), ")");

		// Further indexing should happen with packed rules (array index, not swizzle).
		is_packed = true;
		return true;
	}
	else
		return false;
}